

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMGBndry.cpp
# Opt level: O0

void __thiscall
amrex::MLMGBndry::setLOBndryConds
          (MLMGBndry *this,
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          *lo,Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *hi,int ratio,RealVect *a_loc)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 is_periodic_00;
  reference pvVar4;
  BoundCond *pBVar5;
  undefined4 in_ECX;
  int __c;
  FabSet *__s;
  BndryData *in_RDI;
  Geometry *this_00;
  undefined8 in_R8;
  int idim;
  BCTuple bct;
  int icomp;
  Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
  *bctag;
  RealTuple *bloc;
  Box *grd;
  int i;
  FabSetIter fsi;
  GpuArray<int,_3U> *is_periodic;
  Box *domain;
  Real *dx;
  BoxArray *ba;
  MFIter *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined8 in_stack_fffffffffffffe08;
  BoxArray *in_stack_fffffffffffffe10;
  FabSet *hi_00;
  int in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Box *in_stack_fffffffffffffe80;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined1 local_134 [4];
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 *local_e8;
  undefined4 local_e0;
  Orientation local_dc;
  undefined1 local_d8 [104];
  int local_70;
  RefID local_64;
  int local_5c;
  RefID *local_58;
  Box *local_50;
  MFIter *local_48;
  BoxArray *local_40;
  undefined8 local_38;
  undefined4 local_2c;
  
  local_38 = in_R8;
  local_2c = in_ECX;
  local_40 = BndryRegister::boxes(&in_RDI->super_BndryRegister);
  this_00 = &in_RDI->geom;
  local_48 = (MFIter *)CoordSys::CellSize(&this_00->super_CoordSys);
  local_50 = Geometry::Domain(this_00);
  join_0x00000010_0x00000000_ = Geometry::isPeriodicArray(this_00);
  local_64.data = (BARef *)local_d8._96_8_;
  local_5c = local_70;
  local_58 = &local_64;
  hi_00 = (in_RDI->super_BndryRegister).bndry;
  Orientation::Orientation(&local_dc,0,low);
  iVar2 = Orientation::operator_cast_to_int(&local_dc);
  __s = hi_00 + iVar2;
  FabSetIter::FabSetIter
            ((FabSetIter *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (FabSet *)in_stack_fffffffffffffdf8);
  while( true ) {
    bVar1 = MFIter::isValid((MFIter *)local_d8);
    if (!bVar1) break;
    pcVar3 = MFIter::index((MFIter *)local_d8,(char *)__s,__c);
    local_e0 = SUB84(pcVar3,0);
    BoxArray::operator[](in_stack_fffffffffffffe10,SUB84(in_stack_fffffffffffffe08,4));
    local_e8 = &stack0xfffffffffffffefc;
    LayoutData<std::array<double,_6UL>_>::operator[]
              ((LayoutData<std::array<double,_6UL>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8);
    __s = (FabSet *)local_d8;
    is_periodic_00 =
         LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
         ::operator[]((LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                      in_stack_fffffffffffffdf8);
    uVar6 = 0;
    while( true ) {
      uVar7 = uVar6;
      iVar2 = BndryData::nComp(in_RDI);
      if (iVar2 <= (int)uVar6) break;
      __s = (FabSet *)local_134;
      std::array<amrex::BoundCond,_6UL>::array
                ((array<amrex::BoundCond,_6UL> *)in_stack_fffffffffffffe10);
      Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
      ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (size_type)in_stack_fffffffffffffdf8);
      Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
      ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (size_type)in_stack_fffffffffffffdf8);
      local_158 = 0;
      uStack_150 = 0;
      local_148 = 0;
      in_stack_fffffffffffffe10 = (BoxArray *)&local_158;
      in_stack_fffffffffffffdf8 = local_48;
      in_stack_fffffffffffffe00 = local_2c;
      in_stack_fffffffffffffe08 = local_38;
      setBoxBC((RealTuple *)0x0,(BCTuple *)0x0,(Box *)0x0,in_stack_fffffffffffffe80,
               (Array<LinOpBCType,_3> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (Array<LinOpBCType,_3> *)hi_00,(Real *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffec8,(RealVect *)in_stack_fffffffffffffed0,
               (Array<Real,_3> *)in_stack_fffffffffffffed8,
               (Array<Real,_3> *)CONCAT44(uVar7,in_stack_fffffffffffffee0),
               (GpuArray<int,_3U> *)is_periodic_00);
      for (in_stack_fffffffffffffe78 = 0; in_stack_fffffffffffffe78 < 6;
          in_stack_fffffffffffffe78 = in_stack_fffffffffffffe78 + 1) {
        pvVar4 = std::array<amrex::BoundCond,_6UL>::operator[]
                           ((array<amrex::BoundCond,_6UL> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            (size_type)in_stack_fffffffffffffdf8);
        Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (size_type)in_stack_fffffffffffffdf8);
        __s = (FabSet *)(long)(int)uVar7;
        pBVar5 = Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>::operator[]
                           ((Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            (size_type)in_stack_fffffffffffffdf8);
        pBVar5->bctype = pvVar4->bctype;
      }
      uVar6 = uVar7 + 1;
    }
    MFIter::operator++((MFIter *)local_d8);
  }
  FabSetIter::~FabSetIter((FabSetIter *)0x191e51d);
  return;
}

Assistant:

void
MLMGBndry::setLOBndryConds (const Vector<Array<LinOpBCType,AMREX_SPACEDIM> >& lo,
                            const Vector<Array<LinOpBCType,AMREX_SPACEDIM> >& hi,
                            int ratio, const RealVect& a_loc)
{
    const BoxArray& ba     = boxes();
    const Real*     dx     = geom.CellSize();
    const Box&      domain = geom.Domain();
    const GpuArray<int,AMREX_SPACEDIM>& is_periodic = geom.isPeriodicArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (FabSetIter fsi(bndry[Orientation(0,Orientation::low)]); fsi.isValid(); ++fsi)
    {
        const int                  i     = fsi.index();
        const Box&                 grd   = ba[i];
        RealTuple&                 bloc  = bcloc[fsi];
        Vector< Vector<BoundCond> >& bctag = bcond[fsi];

        for (int icomp = 0; icomp < nComp(); ++icomp) {
            BCTuple bct;
            setBoxBC(bloc, bct, grd, domain, lo[icomp], hi[icomp], dx, ratio,
                     a_loc, {{AMREX_D_DECL(0.,0.,0.)}}, {{AMREX_D_DECL(0.,0.,0.)}},
                     is_periodic);
            for (int idim = 0; idim < 2*AMREX_SPACEDIM; ++idim) {
                bctag[idim][icomp] = bct[idim];
            }
        }
    }
}